

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SPPMIntegrator::SampleLd
          (SPPMIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,LightSamplerHandle *lightSampler)

{
  Vector3f *pVVar1;
  anon_struct_60_5_be74bf41_for_shading *n;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar6;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar7;
  undefined4 uVar10;
  Interval<float> IVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  anon_class_24_3_20c75c41 func;
  anon_class_24_3_20c75c41 func_00;
  Vector3f wiRender;
  Vector3f wiRender_00;
  Tuple3<pbrt::Vector3,_float> TVar14;
  Interaction *pIVar15;
  bool bVar16;
  int iVar17;
  SampledLight *pSVar18;
  ShapeIntersection *pSVar19;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_00;
  long in_FS_OFFSET;
  Float FVar20;
  type tVar21;
  Float FVar22;
  float fVar23;
  Point2f PVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar48 [56];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar37 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  anon_class_16_2_d8f97178 func_01;
  anon_class_16_2_2793a994 func_02;
  anon_class_16_2_d8f97178 func_03;
  SampledSpectrum SVar71;
  Float f_2;
  Float f_3;
  Vector3f wi_1;
  float fStack_36c;
  Vector3f wi;
  Float g;
  SampledSpectrum local_328;
  SampledSpectrum f_1;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_2e8;
  SampledSpectrum Le;
  BSDFSample bs;
  SampledSpectrum Li;
  Tuple3<pbrt::Vector3,_float> local_248;
  SampledSpectrum f;
  LightHandle local_1c0;
  optional<pbrt::SampledLight> sampledLight;
  LightSamplingMode local_19c;
  Interval<float> local_198;
  Interval<float> IStack_190;
  Interval<float> local_188;
  undefined8 local_180;
  float fStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  float fStack_16c;
  anon_struct_8_0_00000001_for___align local_168;
  float fStack_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  Float FStack_150;
  undefined4 uStack_14c;
  MediumHandle local_148;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_140;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar29 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar54 [64];
  undefined1 auVar70 [56];
  
  si.optionalValue._16_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  si.optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  IVar11 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  si.optionalValue._8_4_ = IVar11.low;
  si.optionalValue._12_4_ = IVar11.high;
  uVar3 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar8 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  si.optionalValue._32_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar4 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar9 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  si.optionalValue._44_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  si.optionalValue._24_4_ = uVar3;
  si.optionalValue._28_4_ = uVar8;
  si.optionalValue._36_4_ = uVar4;
  si.optionalValue._40_4_ = uVar9;
  FVar20 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  LightSamplerHandle::Sample(&sampledLight,lightSampler,(LightSampleContext *)&si,FVar20);
  PVar24 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  SampledSpectrum::SampledSpectrum(&local_328,0.0);
  n = &intr->shading;
  if (sampledLight.set == true) {
    pSVar18 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    uVar6 = (pSVar18->light).
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    pIVar15 = &intr->super_Interaction;
    f_1.values.values[0] =
         (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    f_1.values.values[1] =
         (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    f_1.values.values[2] =
         (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    f_1.values.values[3] =
         (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    local_168 = *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values;
    uVar2 = *(undefined8 *)((lambda->lambda).values + 2);
    uVar12 = *(undefined8 *)(lambda->pdf).values;
    uVar13 = *(undefined8 *)((lambda->pdf).values + 2);
    auVar49._12_4_ = 0;
    auVar49._0_4_ = f.values.values[1];
    auVar49._4_4_ = f.values.values[2];
    auVar49._8_4_ = f.values.values[3];
    f.values.values = (array<float,_4>)(auVar49 << 0x20);
    Li.values.values._8_8_ = &wi_1;
    Li.values.values._0_8_ = &f_1;
    bs.f.values.values[0] = (float)(int)uVar6;
    bs.f.values.values[1] = (float)(int)(uVar6 >> 0x20);
    fStack_160 = (float)uVar2;
    fStack_15c = (float)((ulong)uVar2 >> 0x20);
    fStack_158 = (float)uVar12;
    fStack_154 = (float)((ulong)uVar12 >> 0x20);
    FStack_150 = (Float)uVar13;
    uStack_14c = (undefined4)((ulong)uVar13 >> 0x20);
    auVar25._8_8_ = extraout_XMM0_Qb;
    auVar25._0_4_ = PVar24.super_Tuple2<pbrt::Point2,_float>.x;
    auVar25._4_4_ = PVar24.super_Tuple2<pbrt::Point2,_float>.y;
    uVar2 = vmovlps_avx(auVar25);
    wi_1.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
    wi_1.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
    detail::DispatchSplit<9>::operator()(&si);
    if ((0.0 < (float)si.optionalValue._28_4_) &&
       (bVar16 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)&si), bVar16)) {
      pVVar1 = &(intr->super_Interaction).wo;
      TVar14 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
      wi_1.super_Tuple3<pbrt::Vector3,_float>.z = (float)si.optionalValue._24_4_;
      wi_1.super_Tuple3<pbrt::Vector3,_float>.x = (float)si.optionalValue._16_4_;
      wi_1.super_Tuple3<pbrt::Vector3,_float>.y = (float)si.optionalValue._20_4_;
      auVar70 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar48 = ZEXT856(0);
      SVar71 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,
                       (Vector3f)wi_1.super_Tuple3<pbrt::Vector3,_float>,Radiance);
      auVar51._0_8_ = SVar71.values.values._8_8_;
      auVar51._8_56_ = auVar70;
      auVar35._0_8_ = SVar71.values.values._0_8_;
      auVar35._8_56_ = auVar48;
      Li.values.values = (array<float,_4>)vmovlhps_avx(auVar35._0_16_,auVar51._0_16_);
      tVar21 = AbsDot<float>(&wi_1,&n->n);
      auVar48 = extraout_var;
      SVar71 = SampledSpectrum::operator*(&Li,tVar21);
      auVar52._0_8_ = SVar71.values.values._8_8_;
      auVar52._8_56_ = auVar70;
      auVar27._0_8_ = SVar71.values.values._0_8_;
      auVar27._8_56_ = auVar48;
      f_1.values.values = (array<float,_4>)vmovlhps_avx(auVar27._0_16_,auVar52._0_16_);
      bVar16 = SampledSpectrum::operator_cast_to_bool(&f_1);
      if (bVar16) {
        Li.values.values[3] = (float)si.optionalValue._12_4_;
        Li.values.values[2] = (float)si.optionalValue._8_4_;
        Li.values.values._0_8_ = si.optionalValue.__align;
        bVar16 = Integrator::Unoccluded
                           (&this->super_Integrator,&intr->super_Interaction,
                            (Interaction *)((long)&si.optionalValue + 0x28));
        if (bVar16) {
          pSVar18 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
          fVar23 = pSVar18->pdf * (float)si.optionalValue._28_4_;
          auVar48 = (undefined1  [56])0x0;
          if (*(uint *)(uVar6 & 0xffffffffffff) < 2) {
            SVar71 = SampledSpectrum::operator*(&f_1,&Li);
            auVar53._0_8_ = SVar71.values.values._8_8_;
            auVar53._8_56_ = auVar70;
            auVar28._0_8_ = SVar71.values.values._0_8_;
            auVar28._8_56_ = auVar48;
            auVar25 = vmovlhps_avx(auVar28._0_16_,auVar53._0_16_);
            local_168 = auVar25._0_8_;
            fStack_160 = auVar25._8_4_;
            fStack_15c = auVar25._12_4_;
            auVar48 = (undefined1  [56])0x0;
            SVar71 = SampledSpectrum::operator/((SampledSpectrum *)&local_168,fVar23);
            auVar54._0_8_ = SVar71.values.values._8_8_;
            auVar54._8_56_ = auVar70;
            auVar49 = auVar54._0_16_;
            auVar29._0_8_ = SVar71.values.values._0_8_;
            auVar29._8_56_ = auVar48;
            auVar25 = auVar29._0_16_;
          }
          else {
            FVar20 = BSDF::PDF(bsdf,(Vector3f)TVar14,wi_1,Radiance,All);
            if ((SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                 ::reg == '\0') &&
               (iVar17 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                              ::reg), iVar17 != 0)) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                          ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                ::StatsAccumulator__,(PixelAccumFunc)0x0);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                   ::reg);
            }
            auVar70 = (undefined1  [56])0x0;
            *(long *)(in_FS_OFFSET + -0x300) = *(long *)(in_FS_OFFSET + -0x300) + 1;
            auVar48 = ZEXT856(0);
            if (((FVar20 == 0.0) && (!NAN(FVar20))) &&
               (1 < *(ushort *)
                     ((long)&(bsdf->bxdf).
                             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                             .bits + 6) - 3)) {
              *(long *)(in_FS_OFFSET + -0x308) = *(long *)(in_FS_OFFSET + -0x308) + 1;
            }
            SVar71 = SampledSpectrum::operator*(&f_1,&Li);
            auVar55._0_8_ = SVar71.values.values._8_8_;
            auVar55._8_56_ = auVar70;
            auVar30._0_8_ = SVar71.values.values._0_8_;
            auVar30._8_56_ = auVar48;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar30._0_16_,auVar55._0_16_);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(FVar20 * FVar20)),ZEXT416((uint)fVar23),
                                      ZEXT416((uint)fVar23));
            auVar48 = ZEXT856(0);
            SVar71 = SampledSpectrum::operator*(&bs.f,(fVar23 * fVar23) / auVar25._0_4_);
            auVar56._0_8_ = SVar71.values.values._8_8_;
            auVar56._8_56_ = auVar70;
            auVar31._0_8_ = SVar71.values.values._0_8_;
            auVar31._8_56_ = auVar48;
            auVar25 = vmovlhps_avx(auVar31._0_16_,auVar56._0_16_);
            local_168 = auVar25._0_8_;
            fStack_160 = auVar25._8_4_;
            fStack_15c = auVar25._12_4_;
            auVar48 = (undefined1  [56])0x0;
            SVar71 = SampledSpectrum::operator/((SampledSpectrum *)&local_168,fVar23);
            auVar57._0_8_ = SVar71.values.values._8_8_;
            auVar57._8_56_ = auVar70;
            auVar49 = auVar57._0_16_;
            auVar32._0_8_ = SVar71.values.values._0_8_;
            auVar32._8_56_ = auVar48;
            auVar25 = auVar32._0_16_;
          }
          local_328.values.values = (array<float,_4>)vmovlhps_avx(auVar25,auVar49);
        }
      }
    }
  }
  FVar20 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  TVar14 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>;
  auVar33._0_8_ =
       TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
       ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   *)sampler);
  auVar33._8_56_ = extraout_var_00;
  si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar33._0_16_);
  BSDF::Sample_f(&bs,bsdf,(Vector3f)TVar14,FVar20,(Point2f *)&si,Radiance,All);
  auVar48 = ZEXT856(0);
  if ((0.0 < bs.pdf) && (bVar16 = SampledSpectrum::operator_cast_to_bool(&bs.f), bVar16)) {
    wi.super_Tuple3<pbrt::Vector3,_float>.z = bs.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    wi.super_Tuple3<pbrt::Vector3,_float>.x = bs.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    wi.super_Tuple3<pbrt::Vector3,_float>.y = bs.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    tVar21 = AbsDot<float>(&wi,&n->n);
    auVar70 = extraout_var_01;
    SVar71 = SampledSpectrum::operator*(&bs.f,tVar21);
    auVar58._0_8_ = SVar71.values.values._8_8_;
    auVar58._8_56_ = auVar48;
    auVar34._0_8_ = SVar71.values.values._0_8_;
    auVar34._8_56_ = auVar70;
    f.values.values = (array<float,_4>)vmovlhps_avx(auVar34._0_16_,auVar58._0_16_);
    Interaction::SpawnRay((RayDifferential *)&si,&intr->super_Interaction,&wi);
    auVar59 = ZEXT1664(CONCAT412(si.optionalValue._24_4_,
                                 CONCAT84(si.optionalValue._16_8_,si.optionalValue._12_4_)));
    local_148.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = si.optionalValue._36_4_;
    local_148.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = si.optionalValue._32_4_;
    fStack_158 = (float)si.optionalValue._16_8_;
    fStack_154 = (float)((ulong)si.optionalValue._16_8_ >> 0x20);
    FStack_150 = (Float)si.optionalValue._24_4_;
    local_168 = si.optionalValue.__align;
    fStack_160 = (float)si.optionalValue._8_4_;
    fStack_15c = (float)si.optionalValue._12_4_;
    auVar35 = ZEXT464(0x7f800000);
    Integrator::Intersect(&si,&this->super_Integrator,(Ray *)&local_168,INFINITY);
    if (si.set == true) {
      pSVar19 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      auVar26._0_8_ = CONCAT44(fStack_158,fStack_15c) ^ 0x8000000080000000;
      auVar26._8_4_ = 0x80000000;
      auVar26._12_4_ = 0x80000000;
      auVar48 = ZEXT856(auVar26._8_8_);
      auVar50._0_4_ = -fStack_154;
      auVar50._4_4_ = 0x80000000;
      auVar50._8_4_ = 0x80000000;
      auVar50._12_4_ = 0x80000000;
      auVar70 = ZEXT856(auVar50._8_8_);
      uVar2 = vmovlps_avx(auVar26);
      f_1.values.values[2] = auVar50._0_4_;
      f_1.values.values[0] = (float)(int)uVar2;
      f_1.values.values[1] = (float)(int)((ulong)uVar2 >> 0x20);
      SVar71 = SurfaceInteraction::Le(&pSVar19->intr,(Vector3f *)&f_1,lambda);
      auVar60._0_8_ = SVar71.values.values._8_8_;
      auVar60._8_56_ = auVar70;
      auVar36._0_8_ = SVar71.values.values._0_8_;
      auVar36._8_56_ = auVar48;
      Le.values.values = (array<float,_4>)vmovlhps_avx(auVar36._0_16_,auVar60._0_16_);
      auVar48 = ZEXT856(Le.values.values._8_8_);
      bVar16 = SampledSpectrum::operator_cast_to_bool(&Le);
      if (bVar16) {
        if (((undefined1)bs.flags & Specular) == Unset) {
          pSVar19 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          local_2e8.bits =
               (pSVar19->intr).areaLight.
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               .bits;
          pIVar15 = &intr->super_Interaction;
          Li.values.values[0] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          Li.values.values[1] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          Li.values.values[2] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          Li.values.values[3] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          func_01.light = (LightHandle *)&local_140;
          func_01.ctx = (LightSampleContext *)&Li;
          local_140.bits = local_2e8.bits;
          FVar20 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)lightSampler,func_01);
          auVar48 = (undefined1  [56])0x0;
          pIVar15 = &intr->super_Interaction;
          f_1.values.values[0] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          f_1.values.values[1] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          f_1.values.values[2] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          f_1.values.values[3] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          local_248.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          local_248.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_248.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          stack0xfffffffffffffc90 = &local_248;
          wi_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &f_1;
          local_19c = WithMIS;
          func.wi = (Vector3f *)&local_248;
          func.ctx = (LightSampleContext *)&f_1;
          func.mode = &local_19c;
          FVar22 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                               *)&local_2e8,func);
          if (*(ushort *)
               ((long)&(bsdf->bxdf).
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                       .bits + 6) - 3 < 2) {
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar48 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            fVar23 = BSDF::PDF(bsdf,(Vector3f)
                                    (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>,
                               wiRender,Radiance,All);
            auVar70 = extraout_var_02;
          }
          else {
            auVar70 = (undefined1  [56])0x0;
            fVar23 = bs.pdf;
          }
          SVar71 = SampledSpectrum::operator*(&f,&Le);
          auVar67._0_8_ = SVar71.values.values._8_8_;
          auVar67._8_56_ = auVar48;
          auVar45._0_8_ = SVar71.values.values._0_8_;
          auVar45._8_56_ = auVar70;
          _wi_1 = (array<float,_4>)vmovlhps_avx(auVar45._0_16_,auVar67._0_16_);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(FVar22 * FVar20 * FVar22 * FVar20)),
                                    ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
          auVar70 = ZEXT856(0);
          SVar71 = SampledSpectrum::operator*
                             ((SampledSpectrum *)&wi_1,(fVar23 * fVar23) / auVar25._0_4_);
          auVar68._0_8_ = SVar71.values.values._8_8_;
          auVar68._8_56_ = auVar48;
          auVar46._0_8_ = SVar71.values.values._0_8_;
          auVar46._8_56_ = auVar70;
          Li.values.values = (array<float,_4>)vmovlhps_avx(auVar46._0_16_,auVar68._0_16_);
          auVar70 = (undefined1  [56])0x0;
          SVar71 = SampledSpectrum::operator/(&Li,bs.pdf);
          auVar69._0_8_ = SVar71.values.values._8_8_;
          auVar69._8_56_ = auVar48;
          auVar49 = auVar69._0_16_;
          auVar47._0_8_ = SVar71.values.values._0_8_;
          auVar47._8_56_ = auVar70;
          auVar25 = auVar47._0_16_;
        }
        else {
          SVar71 = SampledSpectrum::operator*(&f,&Le);
          auVar65._0_8_ = SVar71.values.values._8_8_;
          auVar65._8_56_ = auVar70;
          auVar43._0_8_ = SVar71.values.values._0_8_;
          auVar43._8_56_ = auVar48;
          Li.values.values = (array<float,_4>)vmovlhps_avx(auVar43._0_16_,auVar65._0_16_);
          auVar48 = (undefined1  [56])0x0;
          SVar71 = SampledSpectrum::operator/(&Li,bs.pdf);
          auVar66._0_8_ = SVar71.values.values._8_8_;
          auVar66._8_56_ = auVar70;
          auVar49 = auVar66._0_16_;
          auVar44._0_8_ = SVar71.values.values._0_8_;
          auVar44._8_56_ = auVar48;
          auVar25 = auVar44._0_16_;
        }
        f_1.values.values = (array<float,_4>)vmovlhps_avx(auVar25,auVar49);
        SampledSpectrum::operator+=(&local_328,&f_1);
      }
    }
    else {
      this_00 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 *)(this->super_Integrator).infiniteLights.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
      pTVar7 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                *)(this->super_Integrator).infiniteLights.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      while( true ) {
        auVar70 = auVar59._8_56_;
        auVar48 = auVar35._8_56_;
        if (this_00 == pTVar7) break;
        func_02.lambda = lambda;
        func_02.ray = (Ray *)&local_168;
        SVar71 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 ::
                 Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                           (this_00,func_02);
        auVar61._0_8_ = SVar71.values.values._8_8_;
        auVar61._8_56_ = auVar70;
        auVar37._0_8_ = SVar71.values.values._0_8_;
        auVar37._8_56_ = auVar48;
        Le.values.values = (array<float,_4>)vmovlhps_avx(auVar37._0_16_,auVar61._0_16_);
        auVar48 = ZEXT856(Le.values.values._8_8_);
        if (((undefined1)bs.flags & Specular) == Unset) {
          pIVar15 = &intr->super_Interaction;
          Li.values.values[0] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          Li.values.values[1] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          Li.values.values[2] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          Li.values.values[3] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          local_1c0.
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits = *(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    *)this_00;
          func_03.light = &local_1c0;
          func_03.ctx = (LightSampleContext *)&Li;
          FVar20 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)lightSampler,func_03);
          local_188 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          auVar48 = (undefined1  [56])0x0;
          local_198 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_190 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          pIVar15 = &intr->super_Interaction;
          f_1.values.values[0] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          f_1.values.values[1] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          f_1.values.values[2] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          f_1.values.values[3] =
               (pIVar15->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          fStack_178 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_180._0_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_180._4_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          fStack_16c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar5 = (n->n).super_Tuple3<pbrt::Normal3,_float>.x;
          uVar10 = (n->n).super_Tuple3<pbrt::Normal3,_float>.y;
          local_2e8.bits = local_2e8.bits & 0xffffffff00000000;
          local_248.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          local_248.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_248.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          stack0xfffffffffffffc90 = &local_248;
          wi_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &f_1;
          func_00.wi = (Vector3f *)&local_248;
          func_00.ctx = (LightSampleContext *)&f_1;
          func_00.mode = (LightSamplingMode *)&local_2e8;
          uStack_174 = uVar5;
          uStack_170 = uVar10;
          FVar22 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             (this_00,func_00);
          if (*(ushort *)
               ((long)&(bsdf->bxdf).
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                       .bits + 6) - 3 < 2) {
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
                 wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                 wi.super_Tuple3<pbrt::Vector3,_float>.x;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                 wi.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar48 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            f_2 = BSDF::PDF(bsdf,(Vector3f)
                                 (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>,
                            wiRender_00,Radiance,All);
            auVar70 = extraout_var_03;
          }
          else {
            auVar70 = (undefined1  [56])0x0;
            f_2 = bs.pdf;
          }
          SVar71 = SampledSpectrum::operator*(&f,&Le);
          auVar63._0_8_ = SVar71.values.values._8_8_;
          auVar63._8_56_ = auVar48;
          auVar40._0_8_ = SVar71.values.values._0_8_;
          auVar40._8_56_ = auVar70;
          _wi_1 = (array<float,_4>)vmovlhps_avx(auVar40._0_16_,auVar63._0_16_);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(FVar22 * FVar20 * FVar22 * FVar20)),
                                    ZEXT416((uint)f_2),ZEXT416((uint)f_2));
          auVar70 = ZEXT856(0);
          SVar71 = SampledSpectrum::operator*((SampledSpectrum *)&wi_1,(f_2 * f_2) / auVar25._0_4_);
          auVar64._0_8_ = SVar71.values.values._8_8_;
          auVar64._8_56_ = auVar48;
          auVar41._0_8_ = SVar71.values.values._0_8_;
          auVar41._8_56_ = auVar70;
          Li.values.values = (array<float,_4>)vmovlhps_avx(auVar41._0_16_,auVar64._0_16_);
          auVar70 = (undefined1  [56])0x0;
          SVar71 = SampledSpectrum::operator/(&Li,bs.pdf);
          auVar59._0_8_ = SVar71.values.values._8_8_;
          auVar59._8_56_ = auVar48;
          auVar42._0_8_ = SVar71.values.values._0_8_;
          auVar42._8_56_ = auVar70;
          auVar25 = auVar42._0_16_;
        }
        else {
          SVar71 = SampledSpectrum::operator*(&f,&Le);
          auVar62._0_8_ = SVar71.values.values._8_8_;
          auVar62._8_56_ = auVar70;
          auVar38._0_8_ = SVar71.values.values._0_8_;
          auVar38._8_56_ = auVar48;
          Li.values.values = (array<float,_4>)vmovlhps_avx(auVar38._0_16_,auVar62._0_16_);
          auVar48 = (undefined1  [56])0x0;
          SVar71 = SampledSpectrum::operator/(&Li,bs.pdf);
          auVar59._0_8_ = SVar71.values.values._8_8_;
          auVar59._8_56_ = auVar70;
          auVar39._0_8_ = SVar71.values.values._0_8_;
          auVar39._8_56_ = auVar48;
          auVar25 = auVar39._0_16_;
        }
        f_1.values.values = (array<float,_4>)vmovlhps_avx(auVar25,auVar59._0_16_);
        auVar35 = ZEXT1664((undefined1  [16])f_1.values.values);
        SampledSpectrum::operator+=(&local_328,&f_1);
        this_00 = this_00 + 8;
      }
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  }
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  return (array<float,_4>)(array<float,_4>)local_328;
}

Assistant:

SampledSpectrum SPPMIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         LightSamplerHandle lightSampler) const {
    // NOTE: share fragments from PathIntegrator::SampleLd here...
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());

    Point2f uLight = sampler.Get2D();

    SampledSpectrum Ld(0.f);

    if (sampledLight) {
        LightHandle light = sampledLight->light;
        DCHECK(light != nullptr && sampledLight->pdf > 0);

        // Sample light source with multiple importance sampling
        LightLiSample ls =
            light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
        if (ls && ls.L) {
            // Evaluate BSDF for light sampling strategy
            Vector3f wo = intr.wo, wi = ls.wi;
            SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
            if (f) {
                SampledSpectrum Li = ls.L;
                if (Unoccluded(intr, ls.pLight)) {
                    // Add light's contribution to reflected radiance
                    Float lightPDF = sampledLight->pdf * ls.pdf;
                    if (IsDeltaLight(light.Type()))
                        Ld = f * Li / lightPDF;
                    else {
                        Float bsdfPDF = bsdf.PDF(wo, wi);
                        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false &&
                                             bsdfPDF == 0);
                        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
                        Ld = f * Li * weight / lightPDF;
                    }
                }
            }
        }
    }

    Float uScattering = sampler.Get1D();
    BSDFSample bs = bsdf.Sample_f(intr.wo, uScattering, sampler.Get2D());
    if (!bs || !bs.f)
        return Ld;

    Vector3f wi = bs.wi;
    SampledSpectrum f = bs.f * AbsDot(wi, intr.shading.n);

    Ray ray = intr.SpawnRay(wi);
    pstd::optional<ShapeIntersection> si = Intersect(ray);
    if (si) {
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF = lightSampler.PDF(intr, areaLight) *
                                 areaLight.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    } else {
        for (const auto &light : infiniteLights) {
            SampledSpectrum Le = light.Le(ray, lambda);
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                Float lightPDF = lightSampler.PDF(intr, light) *
                                 light.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    }
    return Ld;
}